

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineTestRunnerTest.cpp
# Opt level: O0

void __thiscall
TEST_CommandLineTestRunner_listTestGroupAndCaseNamesShouldWorkProperly_Test::testBody
          (TEST_CommandLineTestRunner_listTestGroupAndCaseNamesShouldWorkProperly_Test *this)

{
  UtestShell *pUVar1;
  SimpleString *this_00;
  char *pcVar2;
  undefined1 local_60 [8];
  CommandLineTestRunnerWithStringBufferOutput commandLineTestRunner;
  char *argv [2];
  TEST_CommandLineTestRunner_listTestGroupAndCaseNamesShouldWorkProperly_Test *this_local;
  
  commandLineTestRunner.fakeTCOutputWhichIsReallyABuffer =
       (StringBufferTestOutput *)anon_var_dwarf_66e4;
  CommandLineTestRunnerWithStringBufferOutput::CommandLineTestRunnerWithStringBufferOutput
            ((CommandLineTestRunnerWithStringBufferOutput *)local_60,2,
             (char **)&commandLineTestRunner.fakeTCOutputWhichIsReallyABuffer,
             &(this->super_TEST_GROUP_CppUTestGroupCommandLineTestRunner).registry);
  CommandLineTestRunner::runAllTestsMain((CommandLineTestRunner *)local_60);
  pUVar1 = UtestShell::getCurrent();
  this_00 = StringBufferTestOutput::getOutput
                      (commandLineTestRunner.fakeJUnitOutputWhichIsReallyABuffer_);
  pcVar2 = SimpleString::asCharString(this_00);
  (*pUVar1->_vptr_UtestShell[0xc])
            (pUVar1,"group1.test1",pcVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineTestRunnerTest.cpp"
             ,0x10c);
  CommandLineTestRunnerWithStringBufferOutput::~CommandLineTestRunnerWithStringBufferOutput
            ((CommandLineTestRunnerWithStringBufferOutput *)local_60);
  return;
}

Assistant:

TEST(CommandLineTestRunner, listTestGroupAndCaseNamesShouldWorkProperly)
{
    const char* argv[] = { "tests.exe", "-ln" };

    CommandLineTestRunnerWithStringBufferOutput commandLineTestRunner(2, argv, &registry);
    commandLineTestRunner.runAllTestsMain();

    STRCMP_CONTAINS("group1.test1", commandLineTestRunner.fakeConsoleOutputWhichIsReallyABuffer->getOutput().asCharString());
}